

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  uint uVar1;
  stbi__context *psVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  stbi_uc *psVar10;
  stbi_uc *psVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  stbi_uc *psVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  stbi_uc *__dest;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte *pbVar29;
  int iVar30;
  uint uVar31;
  long lVar32;
  byte *pbVar33;
  
  psVar2 = a->s;
  uVar1 = psVar2->img_n;
  uVar20 = (ulong)uVar1;
  if (uVar1 + 1 != out_n && uVar1 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                  ,0xf7d,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  uVar4 = x * out_n;
  psVar10 = (stbi_uc *)malloc((ulong)(uVar4 * y));
  a->out = psVar10;
  if (psVar10 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
    return 0;
  }
  uVar5 = uVar1 * x;
  uVar6 = uVar5 * depth + 7 >> 3;
  uVar7 = (uVar6 + 1) * y;
  if ((psVar2->img_x == x) && (psVar2->img_y == y)) {
    if (uVar7 == raw_len) {
LAB_0011c4fb:
      if (y == 0) {
        return 1;
      }
      uVar21 = (ulong)uVar4;
      lVar23 = -uVar21;
      lVar15 = (long)out_n;
      iVar8 = x - 1;
      lVar16 = -lVar15;
      uVar7 = 0;
      uVar18 = 0;
      do {
        bVar26 = *raw;
        if (4 < (ulong)bVar26) {
          stbi__g_failure_reason = "invalid filter";
          return 0;
        }
        psVar10 = a->out;
        psVar17 = psVar10 + uVar4 * (int)uVar18;
        psVar11 = psVar17;
        uVar24 = uVar20;
        uVar19 = x;
        if (depth < 8) {
          if (x < uVar6) {
            __assert_fail("img_width_bytes <= x",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                          ,0xf93,
                          "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                         );
          }
          psVar11 = psVar17 + (uVar4 - uVar6);
          uVar24 = 1;
          uVar19 = uVar6;
        }
        if (uVar18 == 0) {
          bVar26 = ""[bVar26];
        }
        uVar22 = (ulong)uVar7;
        iVar14 = (int)uVar24;
        if (0 < iVar14) {
          uVar25 = 0;
          do {
            switch(bVar26) {
            case 0:
            case 1:
            case 5:
            case 6:
              bVar28 = raw[uVar25 + 1];
              goto LAB_0011c655;
            case 2:
            case 4:
              bVar28 = psVar10[uVar25 + uVar22 + lVar23];
              break;
            case 3:
              bVar28 = psVar10[uVar25 + uVar22 + lVar23] >> 1;
              break;
            default:
              goto switchD_0011c63c_default;
            }
            bVar28 = bVar28 + raw[uVar25 + 1];
LAB_0011c655:
            psVar11[uVar25] = bVar28;
switchD_0011c63c_default:
            uVar25 = uVar25 + 1;
          } while (uVar24 != uVar25);
        }
        if (depth == 8) {
          if (uVar1 != out_n) {
            psVar11[(int)uVar1] = 0xff;
          }
          raw = raw + (long)(int)uVar1 + 1;
          lVar32 = lVar15;
        }
        else {
          raw = raw + 2;
          lVar32 = 1;
        }
        __dest = psVar11 + lVar32;
        if (depth < 8 || uVar1 == out_n) {
          uVar19 = (uVar19 - 1) * uVar1;
          switch(bVar26) {
          case 0:
            memcpy(__dest,raw,(long)(int)uVar19);
            break;
          case 1:
            if (0 < (int)uVar19) {
              uVar24 = 0;
              do {
                __dest[uVar24] = psVar11[uVar24 + (lVar32 - iVar14)] + raw[uVar24];
                uVar24 = uVar24 + 1;
              } while (uVar19 != uVar24);
            }
            break;
          case 2:
            if (0 < (int)uVar19) {
              uVar24 = 0;
              do {
                __dest[uVar24] = psVar10[uVar24 + lVar32 + uVar22 + lVar23] + raw[uVar24];
                uVar24 = uVar24 + 1;
              } while (uVar19 != uVar24);
            }
            break;
          case 3:
            if (0 < (int)uVar19) {
              uVar24 = 0;
              do {
                __dest[uVar24] =
                     (char)((uint)psVar11[uVar24 + (lVar32 - iVar14)] +
                            (uint)psVar10[uVar24 + lVar32 + uVar22 + lVar23] >> 1) + raw[uVar24];
                uVar24 = uVar24 + 1;
              } while (uVar19 != uVar24);
            }
            break;
          case 4:
            if (0 < (int)uVar19) {
              uVar24 = 0;
              do {
                bVar26 = psVar11[uVar24 + (lVar32 - iVar14)];
                bVar28 = psVar10[uVar24 + lVar32 + uVar22 + lVar23];
                bVar27 = psVar10[uVar24 + ((lVar32 + uVar22) - (long)iVar14) + lVar23];
                iVar30 = ((uint)bVar28 + (uint)bVar26) - (uint)bVar27;
                uVar12 = iVar30 - (uint)bVar26;
                uVar9 = -uVar12;
                if (0 < (int)uVar12) {
                  uVar9 = uVar12;
                }
                uVar13 = iVar30 - (uint)bVar28;
                uVar12 = -uVar13;
                if (0 < (int)uVar13) {
                  uVar12 = uVar13;
                }
                uVar31 = iVar30 - (uint)bVar27;
                uVar13 = -uVar31;
                if (0 < (int)uVar31) {
                  uVar13 = uVar31;
                }
                if (uVar12 <= uVar13) {
                  bVar27 = bVar28;
                }
                if (uVar13 < uVar9) {
                  bVar26 = bVar27;
                }
                if (uVar12 < uVar9) {
                  bVar26 = bVar27;
                }
                __dest[uVar24] = bVar26 + raw[uVar24];
                uVar24 = uVar24 + 1;
              } while (uVar19 != uVar24);
            }
            break;
          case 5:
            if (0 < (int)uVar19) {
              uVar24 = 0;
              do {
                __dest[uVar24] = (psVar11[uVar24 + (lVar32 - iVar14)] >> 1) + raw[uVar24];
                uVar24 = uVar24 + 1;
              } while (uVar19 != uVar24);
            }
            break;
          case 6:
            if (0 < (int)uVar19) {
              uVar24 = 0;
              do {
                __dest[uVar24] = psVar11[uVar24 + (lVar32 - iVar14)] + raw[uVar24];
                uVar24 = uVar24 + 1;
              } while (uVar19 != uVar24);
            }
          }
          raw = raw + (int)uVar19;
        }
        else {
          if (uVar1 + 1 != out_n) {
            __assert_fail("img_n+1 == out_n",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                          ,0xfc8,
                          "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                         );
          }
          if (bVar26 < 7) {
            psVar17 = psVar17 + lVar32 + lVar23;
            switch(bVar26) {
            case 0:
              for (iVar14 = iVar8; iVar14 != 0; iVar14 = iVar14 + -1) {
                if (0 < (int)uVar1) {
                  uVar24 = 0;
                  do {
                    __dest[uVar24] = raw[uVar24];
                    uVar24 = uVar24 + 1;
                  } while (uVar20 != uVar24);
                }
                __dest[(int)uVar1] = 0xff;
                raw = raw + (int)uVar1;
                __dest = __dest + lVar15;
              }
              break;
            case 1:
              if (iVar8 != 0) {
                psVar11 = psVar11 + lVar32 + lVar16;
                iVar14 = iVar8;
                do {
                  if (0 < (int)uVar1) {
                    uVar24 = 0;
                    do {
                      __dest[uVar24] = psVar11[uVar24] + raw[uVar24];
                      uVar24 = uVar24 + 1;
                    } while (uVar20 != uVar24);
                  }
                  __dest[(int)uVar1] = 0xff;
                  raw = raw + (int)uVar1;
                  __dest = __dest + lVar15;
                  psVar11 = psVar11 + lVar15;
                  iVar14 = iVar14 + -1;
                } while (iVar14 != 0);
              }
              break;
            case 2:
              for (iVar14 = iVar8; iVar14 != 0; iVar14 = iVar14 + -1) {
                if (0 < (int)uVar1) {
                  uVar24 = 0;
                  do {
                    __dest[uVar24] = psVar17[uVar24] + raw[uVar24];
                    uVar24 = uVar24 + 1;
                  } while (uVar20 != uVar24);
                }
                __dest[(int)uVar1] = 0xff;
                raw = raw + (int)uVar1;
                __dest = __dest + lVar15;
                psVar17 = psVar17 + lVar15;
              }
              break;
            case 3:
              if (iVar8 != 0) {
                psVar11 = psVar11 + lVar32 + lVar16;
                iVar14 = iVar8;
                do {
                  if (0 < (int)uVar1) {
                    uVar24 = 0;
                    do {
                      __dest[uVar24] =
                           (char)((uint)psVar11[uVar24] + (uint)psVar17[uVar24] >> 1) + raw[uVar24];
                      uVar24 = uVar24 + 1;
                    } while (uVar20 != uVar24);
                  }
                  __dest[(int)uVar1] = 0xff;
                  raw = raw + (int)uVar1;
                  __dest = __dest + lVar15;
                  psVar17 = psVar17 + lVar15;
                  psVar11 = psVar11 + lVar15;
                  iVar14 = iVar14 + -1;
                } while (iVar14 != 0);
              }
              break;
            case 4:
              if (iVar8 != 0) {
                psVar11 = psVar11 + lVar32 + lVar16;
                psVar10 = psVar10 + lVar32 + uVar22 + (lVar16 - uVar21);
                iVar14 = iVar8;
                do {
                  if (0 < (int)uVar1) {
                    uVar24 = 0;
                    do {
                      bVar26 = psVar11[uVar24];
                      bVar28 = psVar17[uVar24];
                      bVar27 = psVar10[uVar24];
                      iVar30 = ((uint)bVar28 + (uint)bVar26) - (uint)bVar27;
                      uVar9 = iVar30 - (uint)bVar26;
                      uVar19 = -uVar9;
                      if (0 < (int)uVar9) {
                        uVar19 = uVar9;
                      }
                      uVar12 = iVar30 - (uint)bVar28;
                      uVar9 = -uVar12;
                      if (0 < (int)uVar12) {
                        uVar9 = uVar12;
                      }
                      uVar13 = iVar30 - (uint)bVar27;
                      uVar12 = -uVar13;
                      if (0 < (int)uVar13) {
                        uVar12 = uVar13;
                      }
                      if (uVar9 <= uVar12) {
                        bVar27 = bVar28;
                      }
                      if (uVar12 < uVar19) {
                        bVar26 = bVar27;
                      }
                      if (uVar9 < uVar19) {
                        bVar26 = bVar27;
                      }
                      __dest[uVar24] = bVar26 + raw[uVar24];
                      uVar24 = uVar24 + 1;
                    } while (uVar20 != uVar24);
                  }
                  __dest[(int)uVar1] = 0xff;
                  raw = raw + (int)uVar1;
                  __dest = __dest + lVar15;
                  psVar17 = psVar17 + lVar15;
                  psVar11 = psVar11 + lVar15;
                  psVar10 = psVar10 + lVar15;
                  iVar14 = iVar14 + -1;
                } while (iVar14 != 0);
              }
              break;
            case 5:
              if (iVar8 != 0) {
                psVar11 = psVar11 + lVar32 + lVar16;
                iVar14 = iVar8;
                do {
                  if (0 < (int)uVar1) {
                    uVar24 = 0;
                    do {
                      __dest[uVar24] = (psVar11[uVar24] >> 1) + raw[uVar24];
                      uVar24 = uVar24 + 1;
                    } while (uVar20 != uVar24);
                  }
                  __dest[(int)uVar1] = 0xff;
                  raw = raw + (int)uVar1;
                  __dest = __dest + lVar15;
                  psVar11 = psVar11 + lVar15;
                  iVar14 = iVar14 + -1;
                } while (iVar14 != 0);
              }
              break;
            case 6:
              if (iVar8 != 0) {
                psVar11 = psVar11 + lVar32 + lVar16;
                iVar14 = iVar8;
                do {
                  if (0 < (int)uVar1) {
                    uVar24 = 0;
                    do {
                      __dest[uVar24] = psVar11[uVar24] + raw[uVar24];
                      uVar24 = uVar24 + 1;
                    } while (uVar20 != uVar24);
                  }
                  __dest[(int)uVar1] = 0xff;
                  raw = raw + (int)uVar1;
                  __dest = __dest + lVar15;
                  psVar11 = psVar11 + lVar15;
                  iVar14 = iVar14 + -1;
                } while (iVar14 != 0);
              }
            }
          }
        }
        uVar18 = uVar18 + 1;
        uVar7 = uVar7 + uVar4;
        if (uVar18 == y) {
          if (depth < 8) {
            uVar19 = x - 1;
            lVar16 = uVar21 - uVar6;
            lVar15 = (ulong)uVar19 + 1;
            uVar7 = 0;
            uVar20 = 0;
            do {
              bVar26 = 1;
              if (color == 0) {
                bVar26 = ""[(uint)depth];
              }
              psVar10 = a->out;
              pbVar29 = psVar10 + uVar4 * (int)uVar20;
              pbVar33 = pbVar29 + (uVar21 - uVar6);
              uVar18 = (ulong)uVar7;
              if (depth == 4) {
                uVar9 = uVar5;
                if (1 < (int)uVar5) {
                  psVar17 = psVar10 + lVar16;
                  uVar12 = uVar5;
                  do {
                    psVar10[uVar18] = (psVar17[uVar18] >> 4) * bVar26;
                    psVar10[uVar18 + 1] = (psVar17[uVar18] & 0xf) * bVar26;
                    uVar9 = uVar12 - 2;
                    psVar17 = psVar17 + 1;
                    psVar10 = psVar10 + 2;
                    bVar3 = 3 < uVar12;
                    uVar12 = uVar9;
                  } while (bVar3);
                  pbVar33 = psVar17 + uVar18;
                  pbVar29 = psVar10 + uVar18;
                }
                if (uVar9 == 1) {
                  *pbVar29 = (*pbVar33 >> 4) * bVar26;
                }
              }
              else if (depth == 2) {
                uVar9 = uVar5;
                if (3 < (int)uVar5) {
                  psVar17 = psVar10 + lVar16;
                  uVar12 = uVar5;
                  do {
                    psVar10[uVar18] = (psVar17[uVar18] >> 6) * bVar26;
                    psVar10[uVar18 + 1] = (psVar17[uVar18] >> 4 & 3) * bVar26;
                    psVar10[uVar18 + 2] = (psVar17[uVar18] >> 2 & 3) * bVar26;
                    psVar10[uVar18 + 3] = (psVar17[uVar18] & 3) * bVar26;
                    uVar9 = uVar12 - 4;
                    psVar17 = psVar17 + 1;
                    psVar10 = psVar10 + 4;
                    bVar3 = 7 < uVar12;
                    uVar12 = uVar9;
                  } while (bVar3);
                  pbVar33 = psVar17 + uVar18;
                  pbVar29 = psVar10 + uVar18;
                }
                if (((0 < (int)uVar9) && (*pbVar29 = (*pbVar33 >> 6) * bVar26, uVar9 != 1)) &&
                   (pbVar29[1] = (*pbVar33 >> 4 & 3) * bVar26, uVar9 == 3)) {
                  pbVar29[2] = (*pbVar33 >> 2 & 3) * bVar26;
                }
              }
              else if (depth == 1) {
                uVar9 = uVar5;
                if (7 < (int)uVar5) {
                  psVar17 = psVar10 + lVar16;
                  uVar12 = uVar5;
                  do {
                    psVar10[uVar18] = (char)psVar17[uVar18] >> 7 & bVar26;
                    psVar10[uVar18 + 1] = (char)(psVar17[uVar18] * '\x02') >> 7 & bVar26;
                    psVar10[uVar18 + 2] = (char)(psVar17[uVar18] << 2) >> 7 & bVar26;
                    psVar10[uVar18 + 3] = (char)(psVar17[uVar18] << 3) >> 7 & bVar26;
                    psVar10[uVar18 + 4] = (char)(psVar17[uVar18] << 4) >> 7 & bVar26;
                    psVar10[uVar18 + 5] = (char)(psVar17[uVar18] << 5) >> 7 & bVar26;
                    psVar10[uVar18 + 6] = (char)(psVar17[uVar18] << 6) >> 7 & bVar26;
                    bVar28 = bVar26;
                    if ((psVar17[uVar18] & 1) == 0) {
                      bVar28 = 0;
                    }
                    psVar10[uVar18 + 7] = bVar28;
                    uVar9 = uVar12 - 8;
                    psVar17 = psVar17 + 1;
                    psVar10 = psVar10 + 8;
                    bVar3 = 0xf < uVar12;
                    uVar12 = uVar9;
                  } while (bVar3);
                  pbVar33 = psVar17 + uVar18;
                  pbVar29 = psVar10 + uVar18;
                }
                if (((((0 < (int)uVar9) && (*pbVar29 = (char)*pbVar33 >> 7 & bVar26, uVar9 != 1)) &&
                     ((pbVar29[1] = (char)(*pbVar33 * '\x02') >> 7 & bVar26, 2 < uVar9 &&
                      ((pbVar29[2] = (char)(*pbVar33 << 2) >> 7 & bVar26, uVar9 != 3 &&
                       (pbVar29[3] = (char)(*pbVar33 << 3) >> 7 & bVar26, 4 < uVar9)))))) &&
                    (pbVar29[4] = (char)(*pbVar33 << 4) >> 7 & bVar26, uVar9 != 5)) &&
                   (pbVar29[5] = (char)(*pbVar33 << 5) >> 7 & bVar26, uVar9 == 7)) {
                  pbVar29[6] = (char)(*pbVar33 << 6) >> 7 & bVar26;
                }
              }
              if (uVar1 != out_n) {
                psVar10 = a->out;
                if (uVar1 == 1) {
                  lVar23 = lVar15;
                  if (-1 < (int)uVar19) {
                    do {
                      psVar10[lVar23 * 2 + (uVar18 - 1)] = 0xff;
                      psVar10[lVar23 * 2 + (uVar18 - 2)] = psVar10[lVar23 + (uVar18 - 1)];
                      lVar32 = lVar23 + -1;
                      bVar3 = 0 < lVar23;
                      lVar23 = lVar32;
                    } while (lVar32 != 0 && bVar3);
                  }
                }
                else {
                  if (uVar1 != 3) {
                    __assert_fail("img_n == 3",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                                  ,0x1018,
                                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                                 );
                  }
                  if (-1 < (int)uVar19) {
                    psVar17 = psVar10 + (ulong)uVar19 * 3 + 2 + uVar18;
                    lVar23 = lVar15;
                    do {
                      psVar10[lVar23 * 4 + (uVar18 - 1)] = 0xff;
                      psVar10[lVar23 * 4 + (uVar18 - 2)] = *psVar17;
                      psVar10[lVar23 * 4 + (uVar18 - 3)] = psVar17[-1];
                      psVar10[lVar23 * 4 + (uVar18 - 4)] = psVar17[-2];
                      psVar17 = psVar17 + -3;
                      lVar32 = lVar23 + -1;
                      bVar3 = 0 < lVar23;
                      lVar23 = lVar32;
                    } while (lVar32 != 0 && bVar3);
                  }
                }
              }
              uVar20 = uVar20 + 1;
              uVar7 = uVar7 + uVar4;
            } while (uVar20 != y);
          }
          return 1;
        }
      } while( true );
    }
  }
  else if (uVar7 <= raw_len) goto LAB_0011c4fb;
  stbi__g_failure_reason = "not enough pixels";
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc(x * y * out_n); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;
   if (s->img_x == x && s->img_y == y) {
      if (raw_len != img_len) return stbi__err("not enough pixels","Corrupt PNG");
   } else { // interlaced:
      if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");
   }

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior = cur - stride;
      int filter = *raw++;
      int filter_bytes = img_n;
      int width = x;
      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*img_n;
         #define CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); break;
         }
         #undef CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[img_n]=255,raw+=img_n,cur+=out_n,prior+=out_n) \
                   for (k=0; k < img_n; ++k)
         switch (filter) {
            CASE(STBI__F_none)         cur[k] = raw[k]; break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-out_n]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-out_n])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-out_n],prior[k],prior[k-out_n])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-out_n] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-out_n],0,0)); break;
         }
         #undef CASE
      }
   }

   // we make a separate pass to expand bits to pixels; for performance,
   // this could run two scanlines behind the above code, so it won't
   // intefere with filtering but will still be in the cache.
   if (depth < 8) {
      for (j=0; j < y; ++j) {
         stbi_uc *cur = a->out + stride*j;
         stbi_uc *in  = a->out + stride*j + x*out_n - img_width_bytes;
         // unpack 1/2/4-bit into a 8-bit buffer. allows us to keep the common 8-bit path optimal at minimal cost for 1/2/4-bit
         // png guarante byte alignment, if width is not multiple of 8/4/2 we'll decode dummy trailing data that will be skipped in the later loop
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range

         // note that the final byte might overshoot and write more data than desired.
         // we can allocate enough data that this never writes out of memory, but it
         // could also overwrite the next scanline. can it overwrite non-empty data
         // on the next scanline? yes, consider 1-pixel-wide scanlines with 1-bit-per-pixel.
         // so we need to explicitly clamp the final ones

         if (depth == 4) {
            for (k=x*img_n; k >= 2; k-=2, ++in) {
               *cur++ = scale * ((*in >> 4)       );
               *cur++ = scale * ((*in     ) & 0x0f);
            }
            if (k > 0) *cur++ = scale * ((*in >> 4)       );
         } else if (depth == 2) {
            for (k=x*img_n; k >= 4; k-=4, ++in) {
               *cur++ = scale * ((*in >> 6)       );
               *cur++ = scale * ((*in >> 4) & 0x03);
               *cur++ = scale * ((*in >> 2) & 0x03);
               *cur++ = scale * ((*in     ) & 0x03);
            }
            if (k > 0) *cur++ = scale * ((*in >> 6)       );
            if (k > 1) *cur++ = scale * ((*in >> 4) & 0x03);
            if (k > 2) *cur++ = scale * ((*in >> 2) & 0x03);
         } else if (depth == 1) {
            for (k=x*img_n; k >= 8; k-=8, ++in) {
               *cur++ = scale * ((*in >> 7)       );
               *cur++ = scale * ((*in >> 6) & 0x01);
               *cur++ = scale * ((*in >> 5) & 0x01);
               *cur++ = scale * ((*in >> 4) & 0x01);
               *cur++ = scale * ((*in >> 3) & 0x01);
               *cur++ = scale * ((*in >> 2) & 0x01);
               *cur++ = scale * ((*in >> 1) & 0x01);
               *cur++ = scale * ((*in     ) & 0x01);
            }
            if (k > 0) *cur++ = scale * ((*in >> 7)       );
            if (k > 1) *cur++ = scale * ((*in >> 6) & 0x01);
            if (k > 2) *cur++ = scale * ((*in >> 5) & 0x01);
            if (k > 3) *cur++ = scale * ((*in >> 4) & 0x01);
            if (k > 4) *cur++ = scale * ((*in >> 3) & 0x01);
            if (k > 5) *cur++ = scale * ((*in >> 2) & 0x01);
            if (k > 6) *cur++ = scale * ((*in >> 1) & 0x01);
         }
         if (img_n != out_n) {
            // insert alpha = 255
            stbi_uc *cur = a->out + stride*j;
            int i;
            if (img_n == 1) {
               for (i=x-1; i >= 0; --i) {
                  cur[i*2+1] = 255;
                  cur[i*2+0] = cur[i];
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (i=x-1; i >= 0; --i) {
                  cur[i*4+3] = 255;
                  cur[i*4+2] = cur[i*3+2];
                  cur[i*4+1] = cur[i*3+1];
                  cur[i*4+0] = cur[i*3+0];
               }
            }
         }
      }
   }

   return 1;
}